

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O1

void BGIP_SolverCE::OrderedInsertJPPVValuePair
               (JPPVValuePair *pv,list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *l)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Self __tmp;
  double dVar3;
  double dVar4;
  
  dVar3 = (double)(**(code **)(*(long *)pv + 0x18))();
  p_Var2 = (l->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    if (p_Var2 == (_List_node_base *)l) {
      p_Var2 = (_List_node_base *)operator_new(0x18);
      p_Var2[1]._M_next = (_List_node_base *)pv;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      psVar1 = &(l->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return;
    }
    dVar4 = (double)(**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x18))();
    if (dVar4 <= dVar3) break;
    p_Var2 = (((_List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)&p_Var2->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)pv;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(l->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>)._M_impl._M_node
            ._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

static void OrderedInsertJPPVValuePair(JPPVValuePair* pv, 
                                           std::list<JPPVValuePair*>& l)
        {
            double v_pv = pv->GetValue();
            std::list<JPPVValuePair*>::iterator it = l.begin(); //=front - highest values
            std::list<JPPVValuePair*>::iterator last = l.end(); //=back - lowest values
            while(it != last)
            {
                JPPVValuePair* temp = *it;
                double val = temp->GetValue();
                if( v_pv < val )
                {
                    it++;
                }
                else
                {
                    l.insert(it, pv);
                    return;
                }
            }
            //this should only happen when size=0
            l.insert(last, pv);
        }